

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

uniformIVecFunctionPointer __thiscall
gl4cts::GPUShaderFP64Test10::getUniformFunctionForIVec
          (GPUShaderFP64Test10 *this,GLuint argument,functionObject *function_object)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  undefined4 in_register_00000034;
  
  iVar1 = (*function_object->_vptr_functionObject[4])
                    (function_object,CONCAT44(in_register_00000034,argument));
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (iVar1 - 0x12U < 4) {
    return *(uniformIVecFunctionPointer *)
            (CONCAT44(extraout_var,iVar2) + 0x14f8 + (ulong)(iVar1 - 0x12U) * 0x40);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
             ,0x3887);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GPUShaderFP64Test10::uniformIVecFunctionPointer GPUShaderFP64Test10::getUniformFunctionForIVec(
	glw::GLuint argument, const functionObject& function_object) const
{
	const Utils::_variable_type argument_type = function_object.getArgumentType(argument);
	const glw::Functions&		gl			  = m_context.getRenderContext().getFunctions();

	switch (argument_type)
	{
	case Utils::VARIABLE_TYPE_INT:
		return gl.uniform1iv;
		break;
	case Utils::VARIABLE_TYPE_IVEC2:
		return gl.uniform2iv;
		break;
	case Utils::VARIABLE_TYPE_IVEC3:
		return gl.uniform3iv;
		break;
	case Utils::VARIABLE_TYPE_IVEC4:
		return gl.uniform4iv;
		break;
	default:
		TCU_FAIL("Not implemented");
		break;
	}

	return 0;
}